

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ir_context.h
# Opt level: O3

void __thiscall spvtools::opt::IRContext::BuildTypeManager(IRContext *this)

{
  byte *pbVar1;
  TypeManager *__ptr;
  TypeManager *this_00;
  
  this_00 = (TypeManager *)operator_new(0x140);
  analysis::TypeManager::TypeManager(this_00,&this->consumer_,this);
  __ptr = (this->type_mgr_)._M_t.
          super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
          ._M_t.
          super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
          .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl;
  (this->type_mgr_)._M_t.
  super___uniq_ptr_impl<spvtools::opt::analysis::TypeManager,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  ._M_t.
  super__Tuple_impl<0UL,_spvtools::opt::analysis::TypeManager_*,_std::default_delete<spvtools::opt::analysis::TypeManager>_>
  .super__Head_base<0UL,_spvtools::opt::analysis::TypeManager_*,_false>._M_head_impl = this_00;
  if (__ptr != (TypeManager *)0x0) {
    std::default_delete<spvtools::opt::analysis::TypeManager>::operator()
              ((default_delete<spvtools::opt::analysis::TypeManager> *)&this->type_mgr_,__ptr);
  }
  pbVar1 = (byte *)((long)&this->valid_analyses_ + 1);
  *pbVar1 = *pbVar1 | 0x80;
  return;
}

Assistant:

void BuildTypeManager() {
    type_mgr_ = MakeUnique<analysis::TypeManager>(consumer(), this);
    valid_analyses_ = valid_analyses_ | kAnalysisTypes;
  }